

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

uint __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::find_index(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
             *this,vec<6U,_float> *k)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  node *pnStack_30;
  int orig_index;
  node *pNode;
  int index;
  vec<6U,_float> *k_local;
  hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
  *this_local;
  
  if (this->m_num_valid != 0) {
    uVar2 = hash_key(this,k);
    pnStack_30 = get_node(this,uVar2);
    if (pnStack_30->state != '\0') {
      bVar1 = equal_to<crnlib::vec<6U,_float>_>::operator()
                        ((equal_to<crnlib::vec<6U,_float>_> *)&this->field_0x15,
                         (vec<6U,_float> *)pnStack_30,k);
      pNode._4_4_ = uVar2;
      if (bVar1) {
        return uVar2;
      }
      while( true ) {
        if (pNode._4_4_ == 0) {
          uVar3 = vector<crnlib::hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>::raw_node>
                  ::size(&this->m_values);
          pNode._4_4_ = uVar3 - 1;
          pnStack_30 = get_node(this,pNode._4_4_);
        }
        else {
          pNode._4_4_ = pNode._4_4_ - 1;
          pnStack_30 = pnStack_30 + -1;
        }
        if ((pNode._4_4_ == uVar2) || (pnStack_30->state == '\0')) break;
        bVar1 = equal_to<crnlib::vec<6U,_float>_>::operator()
                          ((equal_to<crnlib::vec<6U,_float>_> *)&this->field_0x15,
                           (vec<6U,_float> *)pnStack_30,k);
        if (bVar1) {
          return pNode._4_4_;
        }
      }
    }
  }
  uVar2 = vector<crnlib::hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>::raw_node>
          ::size(&this->m_values);
  return uVar2;
}

Assistant:

inline uint find_index(const Key& k) const
        {
            if (m_num_valid)
            {
                int index = hash_key(k);
                const node* pNode = &get_node(index);

                if (pNode->state)
                {
                    if (m_equals(pNode->first, k))
                    {
                        return index;
                    }

                    const int orig_index = index;

                    for (;;)
                    {
                        if (!index)
                        {
                            index = m_values.size() - 1;
                            pNode = &get_node(index);
                        }
                        else
                        {
                            index--;
                            pNode--;
                        }

                        if (index == orig_index)
                        {
                            break;
                        }

                        if (!pNode->state)
                        {
                            break;
                        }

                        if (m_equals(pNode->first, k))
                        {
                            return index;
                        }
                    }
                }
            }

            return m_values.size();
        }